

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

char fsnav_add_plugin(_func_void *newplugin)

{
  fsnav_plugin *pfVar1;
  fsnav_plugin *reallocated_pointer;
  _func_void *newplugin_local;
  
  if ((fsnav->core).plugin_count + 1 < 0xffffffff) {
    pfVar1 = (fsnav_plugin *)realloc((fsnav->core).plugins,((fsnav->core).plugin_count + 1) * 0x18);
    if (pfVar1 == (fsnav_plugin *)0x0) {
      fsnav_free();
      newplugin_local._7_1_ = '\0';
    }
    else {
      (fsnav->core).plugins = pfVar1;
      (fsnav->core).plugins[(fsnav->core).plugin_count].func = newplugin;
      (fsnav->core).plugins[(fsnav->core).plugin_count].cycle = 1;
      (fsnav->core).plugins[(fsnav->core).plugin_count].shift = 0;
      (fsnav->core).plugins[(fsnav->core).plugin_count].tick = 0;
      (fsnav->core).plugin_count = (fsnav->core).plugin_count + 1;
      newplugin_local._7_1_ = '\x01';
    }
  }
  else {
    newplugin_local._7_1_ = '\0';
  }
  return newplugin_local._7_1_;
}

Assistant:

char fsnav_add_plugin(void(*newplugin)(void))
{
	fsnav_plugin* reallocated_pointer;

	if (fsnav->core.plugin_count + 1 >= UINT_MAX)
		return 0;

	reallocated_pointer = (fsnav_plugin*)realloc((void*)(fsnav->core.plugins), (fsnav->core.plugin_count + 1)*sizeof(fsnav_plugin));

	if (reallocated_pointer == NULL) { // failed to allocate/realocate memory
		fsnav_free();
		return 0;
	} 
	else
		fsnav->core.plugins = reallocated_pointer;

	fsnav->core.plugins[fsnav->core.plugin_count].func  = newplugin;
	fsnav->core.plugins[fsnav->core.plugin_count].cycle = 1;
	fsnav->core.plugins[fsnav->core.plugin_count].shift = 0;
	fsnav->core.plugins[fsnav->core.plugin_count].tick  = 0;
	fsnav->core.plugin_count++;

	return 1;
}